

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O3

uint32_t helper_bcds_ppc64(ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b,uint32_t ps)

{
  char cVar1;
  uint64_t uVar2;
  _Bool _Var3;
  byte bVar4;
  ulong uVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  _Bool ox_flag;
  ppc_avr_t ret;
  _Bool local_39;
  byte local_38;
  undefined7 uStack_37;
  undefined1 uStack_30;
  undefined4 uStack_2f;
  undefined2 uStack_2b;
  uint8_t uStack_29;
  
  cVar1 = a->s8[8];
  iVar8 = (int)cVar1;
  local_39 = false;
  bVar4 = b->u8[0];
  uVar2 = b->u64[1];
  local_38 = (byte)b->u64[0];
  uStack_37 = (undefined7)(b->u64[0] >> 8);
  uStack_30 = (undefined1)uVar2;
  uStack_2f = (undefined4)(uVar2 >> 8);
  uStack_2b = (undefined2)(uVar2 >> 0x28);
  uStack_29 = (uint8_t)(uVar2 >> 0x38);
  local_38 = local_38 & 0xf0;
  _Var3 = bcd_is_valid(b);
  if (!_Var3) {
    return 1;
  }
  if (cVar1 < ' ') {
    if (cVar1 < -0x1f) {
      iVar8 = -0x1f;
    }
    else if ('\0' < cVar1) goto LAB_00b569c9;
    urshift((uint64_t *)&local_38,(uint64_t *)&uStack_30,iVar8 * -4);
  }
  else {
    iVar8 = 0x1f;
LAB_00b569c9:
    ulshift((uint64_t *)&local_38,(uint64_t *)&uStack_30,iVar8 << 2,&local_39);
  }
  bVar6 = 0xd;
  if (((bVar4 & 0xf) - 0xb & 0xfd) != 0) {
    bVar6 = (ps != 0) * '\x03' + 0xc;
  }
  r->u8[0] = local_38 & 0xf0 | bVar6;
  *(ulong *)((long)&(r->f128).low + 1) = CONCAT17(uStack_30,uStack_37);
  *(undefined4 *)(r->u8 + 9) = uStack_2f;
  *(undefined2 *)(r->u8 + 0xd) = uStack_2b;
  r->u8[0xf] = uStack_29;
  if (r->u64[1] == 0) {
    uVar5 = r->u64[0];
    uVar7 = 2;
    if (uVar5 < 0x10) goto LAB_00b56a89;
  }
  else {
    uVar5 = (ulong)r->u8[0];
  }
  bVar4 = ((byte)uVar5 & 0xf) - 10;
  uVar7 = 8;
  if (bVar4 < 6) {
    uVar7 = *(uint *)(&DAT_00db47d8 + (ulong)bVar4 * 4);
  }
LAB_00b56a89:
  return local_39 | uVar7;
}

Assistant:

uint32_t helper_bcds(ppc_avr_t *r, ppc_avr_t *a, ppc_avr_t *b, uint32_t ps)
{
    int cr;
    int i = a->VsrSB(7);
    bool ox_flag = false;
    int sgnb = bcd_get_sgn(b);
    ppc_avr_t ret = *b;
    ret.VsrD(1) &= ~0xf;

    if (bcd_is_valid(b) == false) {
        return CRF_SO;
    }

    if (unlikely(i > 31)) {
        i = 31;
    } else if (unlikely(i < -31)) {
        i = -31;
    }

    if (i > 0) {
        ulshift(&ret.VsrD(1), &ret.VsrD(0), i * 4, &ox_flag);
    } else {
        urshift(&ret.VsrD(1), &ret.VsrD(0), -i * 4);
    }
    bcd_put_digit(&ret, bcd_preferred_sgn(sgnb, ps), 0);

    *r = ret;

    cr = bcd_cmp_zero(r);
    if (ox_flag) {
        cr |= CRF_SO;
    }

    return cr;
}